

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject_test_app.cpp
# Opt level: O0

void __thiscall Snake::crawl(Snake *this)

{
  ostream *poVar1;
  Snake *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
  poVar1 = std::operator<<(poVar1,"] Called ");
  poVar1 = std::operator<<(poVar1,"crawl");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void crawl() { LOG_FUNCTION_CALL(); }